

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

void __thiscall
QList<QMakeParser::ParseCtx>::resize_internal(QList<QMakeParser::ParseCtx> *this,qsizetype newSize)

{
  bool bVar1;
  qsizetype qVar2;
  QPodArrayOps<QMakeParser::ParseCtx> *this_00;
  __off_t __length;
  QArrayDataPointer<QMakeParser::ParseCtx> *in_RSI;
  QArrayDataPointer<QMakeParser::ParseCtx> *in_RDI;
  QArrayDataPointer<QMakeParser::ParseCtx> *in_stack_ffffffffffffffd0;
  QArrayDataPointer<QMakeParser::ParseCtx> *this_01;
  QArrayDataPointer<QMakeParser::ParseCtx> *in_stack_ffffffffffffffd8;
  QArrayDataPointer<QMakeParser::ParseCtx> *in_stack_ffffffffffffffe0;
  QArrayDataPointer<QMakeParser::ParseCtx> *__file;
  
  QArrayDataPointer<QMakeParser::ParseCtx>::operator->(in_RDI);
  bVar1 = QArrayDataPointer<QMakeParser::ParseCtx>::needsDetach(in_stack_ffffffffffffffd0);
  this_01 = in_RSI;
  if (!bVar1) {
    in_stack_ffffffffffffffd8 =
         (QArrayDataPointer<QMakeParser::ParseCtx> *)
         capacity((QList<QMakeParser::ParseCtx> *)0x319791);
    qVar2 = QArrayDataPointer<QMakeParser::ParseCtx>::freeSpaceAtBegin(in_stack_ffffffffffffffd8);
    in_stack_ffffffffffffffe0 = in_RSI;
    if ((long)in_RSI <= (long)in_stack_ffffffffffffffd8 - qVar2) {
      __file = this_01;
      qVar2 = size((QList<QMakeParser::ParseCtx> *)in_RDI);
      if (qVar2 <= (long)this_01) {
        return;
      }
      this_00 = (QPodArrayOps<QMakeParser::ParseCtx> *)
                QArrayDataPointer<QMakeParser::ParseCtx>::operator->(in_RDI);
      QtPrivate::QPodArrayOps<QMakeParser::ParseCtx>::truncate(this_00,(char *)__file,__length);
      return;
    }
  }
  QArrayDataPointer<QMakeParser::ParseCtx>::detachAndGrow
            (this_01,(GrowthPosition)((ulong)in_RDI >> 0x20),(qsizetype)in_stack_ffffffffffffffe0,
             (ParseCtx **)in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  return;
}

Assistant:

inline void QList<T>::resize_internal(qsizetype newSize)
{
    Q_ASSERT(newSize >= 0);

    if (d->needsDetach() || newSize > capacity() - d.freeSpaceAtBegin()) {
        d.detachAndGrow(QArrayData::GrowsAtEnd, newSize - d.size, nullptr, nullptr);
    } else if (newSize < size()) {
        d->truncate(newSize);
    }
}